

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

leb_Node leb_BoundingNode_Quad(leb_Heap *leb,float x,float y)

{
  float fVar1;
  bool bVar2;
  byte local_69;
  float t;
  float s;
  float local_20;
  float local_1c;
  float y_local;
  float x_local;
  leb_Heap *leb_local;
  leb_Node node;
  
  memset(&leb_local,0,8);
  if ((((0.0 <= x) && (0.0 <= y)) && (x <= 1.0)) && (y <= 1.0)) {
    if (1.0 < x + y) {
      leb_local = (leb_Heap *)0x100000003;
      local_1c = 1.0 - x;
      local_20 = 1.0 - y;
    }
    else {
      leb_local = (leb_Heap *)0x100000002;
      local_20 = y;
      local_1c = x;
    }
    while( true ) {
      fVar1 = local_20;
      bVar2 = leb_IsLeafNode(leb,(leb_Node)leb_local);
      local_69 = 0;
      if (!bVar2) {
        bVar2 = leb_IsCeilNode(leb,(leb_Node)leb_local);
        local_69 = bVar2 ^ 0xff;
      }
      if ((local_69 & 1) == 0) break;
      if (local_20 <= local_1c) {
        leb_local = (leb_Heap *)leb__RightChildNode((leb_Node)leb_local);
        local_20 = (1.0 - local_1c) - local_20;
      }
      else {
        leb_local = (leb_Heap *)leb__LeftChildNode((leb_Node)leb_local);
        local_20 = local_20 - local_1c;
        local_1c = 1.0 - local_1c;
      }
      local_1c = local_1c - fVar1;
    }
  }
  return (leb_Node)leb_local;
}

Assistant:

LEBDEF leb_Node leb_BoundingNode_Quad(const leb_Heap *leb, float x, float y)
{
    leb_Node node = {0u, 0};

    if (x >= 0.0f && y >= 0.0f && x <= 1.0f && y <= 1.0f) {
        if (x + y <= 1.0f) {
            node = {2u, 1};
        } else {
            node = {3u, 1};
            x = 1 - x;
            y = 1 - y;
        }

        while (!leb_IsLeafNode(leb, node) && !leb_IsCeilNode(leb, node)) {
            float s = x, t = y;

            if (s < t) {
                node = leb__LeftChildNode(node);
                x = (1.0f - s - t);
                y = (t - s);
            } else {
                node = leb__RightChildNode(node);
                x = (s - t);
                y = (1.0f - s - t);
            }
        }
    }

    return node;
}